

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O0

void __thiscall QLatin1StringMatcher::setSearcher(QLatin1StringMatcher *this)

{
  char c;
  longlong *plVar1;
  size_t sVar2;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype bufferSize;
  QCaseInsensitiveLatin1Hash foldCase;
  undefined7 in_stack_ffffffffffffff98;
  QLatin1Char in_stack_ffffffffffffff9f;
  QLatin1String *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffc0;
  char *pat_last;
  char *in_stack_ffffffffffffffc8;
  char *pat_first;
  QLatin1String *this_00;
  QLatin1Char local_21;
  longlong local_20;
  qsizetype local_18;
  QCaseInsensitiveLatin1Hash local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)in_RDI[1].m_size == 1) {
    QLatin1String::data(in_RDI);
    QLatin1String::end(in_stack_ffffffffffffffa0);
    QtPrivate::
    q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseSensitiveLatin1Hash,_std::equal_to<void>_>
    ::q_boyer_moore_searcher_hashed_needle
              ((q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseSensitiveLatin1Hash,_std::equal_to<void>_>
                *)in_RDI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    local_9 = (QCaseInsensitiveLatin1Hash)0xaa;
    this_00 = in_RDI;
    local_18 = QLatin1String::size(in_RDI);
    local_20 = 0x100;
    plVar1 = std::min<long_long>(&local_18,&local_20);
    pat_first = (char *)*plVar1;
    for (pat_last = (char *)0x0; (long)pat_last < (long)pat_first; pat_last = pat_last + 1) {
      in_stack_ffffffffffffff9f =
           QLatin1String::operator[]
                     ((QLatin1String *)
                      CONCAT17(in_stack_ffffffffffffff9f.ch,in_stack_ffffffffffffff98),0x4c2f5d);
      local_21 = in_stack_ffffffffffffff9f;
      c = QLatin1Char::toLatin1(&local_21);
      sVar2 = QtPrivate::QCaseInsensitiveLatin1Hash::operator()(&local_9,c);
      pat_last[(long)&in_RDI[0x12].m_size] = (char)sVar2;
    }
    QtPrivate::
    q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseInsensitiveLatin1Hash,_std::equal_to<void>_>
    ::q_boyer_moore_searcher_hashed_needle
              ((q_boyer_moore_searcher_hashed_needle<const_char_*,_QtPrivate::QCaseInsensitiveLatin1Hash,_std::equal_to<void>_>
                *)this_00,pat_first,pat_last);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLatin1StringMatcher::setSearcher() noexcept
{
    if (m_cs == Qt::CaseSensitive) {
        new (&m_caseSensitiveSearcher) CaseSensitiveSearcher(m_pattern.data(), m_pattern.end());
    } else {
        QtPrivate::QCaseInsensitiveLatin1Hash foldCase;
        qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        for (qsizetype i = 0; i < bufferSize; ++i)
            m_foldBuffer[i] = static_cast<char>(foldCase(m_pattern[i].toLatin1()));

        new (&m_caseInsensitiveSearcher)
                CaseInsensitiveSearcher(m_foldBuffer, &m_foldBuffer[bufferSize]);
    }
}